

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

void __thiscall
capnp::compiler::NodeTranslator::StructTranslator::MemberInfo::finishGroup(MemberInfo *this)

{
  void *pvVar1;
  uint64_t *puVar2;
  uint64_t uVar3;
  Builder local_40;
  
  if ((this->field_21).unionScope != (Union *)0x0) {
    StructLayout::Union::addDiscriminant((this->field_21).unionScope);
    pvVar1 = (this->node)._builder.data;
    *(short *)((long)pvVar1 + 0x1e) = (short)this->unionDiscriminantCount;
    if ((((this->field_21).unionScope)->discriminantOffset).ptr.isSet == false) {
      kj::_::Debug::Fault::Fault
                ((Fault *)&local_40,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
                 ,0x79c,FAILED,"unionScope->discriminantOffset != nullptr","");
      kj::_::Debug::Fault::fatal((Fault *)&local_40);
    }
    *(anon_union_4_1_a8c68091_for_NullableValue<unsigned_int>_2 *)((long)pvVar1 + 0x20) =
         (((this->field_21).unionScope)->discriminantOffset).ptr.field_1;
  }
  if (this->parent != (MemberInfo *)0x0) {
    uVar3 = generateGroupId(*(this->parent->node)._builder.data,(uint16_t)this->index);
    puVar2 = (uint64_t *)(this->node)._builder.data;
    *puVar2 = uVar3;
    puVar2[2] = *(this->parent->node)._builder.data;
    getSchema(&local_40,this);
    *(undefined2 *)((long)local_40._builder.data + 8) = 1;
    *(undefined8 *)((long)local_40._builder.data + 0x10) = 0;
    *(uint64_t *)((long)local_40._builder.data + 0x10) = uVar3;
    *(uint64_t *)(this->sourceInfo)._builder.data = uVar3;
    if ((this->docComment).ptr.isSet == true) {
      capnp::schema::Node::SourceInfo::Builder::setDocComment
                (&this->sourceInfo,
                 (Reader)(this->docComment).ptr.field_1.value.super_StringPtr.content);
    }
  }
  return;
}

Assistant:

void finishGroup() {
      if (unionScope != nullptr) {
        unionScope->addDiscriminant();  // if it hasn't happened already
        auto structNode = node.getStruct();
        structNode.setDiscriminantCount(unionDiscriminantCount);
        structNode.setDiscriminantOffset(KJ_ASSERT_NONNULL(unionScope->discriminantOffset));
      }

      if (parent != nullptr) {
        uint64_t groupId = generateGroupId(parent->node.getId(), index);
        node.setId(groupId);
        node.setScopeId(parent->node.getId());
        getSchema().initGroup().setTypeId(groupId);

        sourceInfo.setId(groupId);
        KJ_IF_MAYBE(dc, docComment) {
          sourceInfo.setDocComment(*dc);
        }
      }
    }